

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::atou<unsigned_long>(c4 *this,csubstr str,unsigned_long *v)

{
  char cVar1;
  code *pcVar2;
  byte bVar3;
  undefined1 uVar4;
  char *pcVar5;
  size_t sVar6;
  ulong *puVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  bool bVar11;
  basic_substring<const_char> local_28;
  
  puVar7 = (ulong *)str.len;
  pcVar9 = str.str;
  if (pcVar9 != (char *)0x0) {
    if (this == (c4 *)0x0) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar2 = (code *)swi(3);
        uVar4 = (*pcVar2)();
        return (bool)uVar4;
      }
      handle_error(0x20a4ad,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c6,"len > 0 && str != nullptr");
    }
    if (*this == (c4)0x30) {
      if (pcVar9 == (char *)0x1) {
        *puVar7 = 0;
        return true;
      }
      bVar3 = (byte)this[1] & 0xdf;
      if (bVar3 == 0x42) {
        if (pcVar9 != (char *)0x2) {
          basic_substring<const_char>::basic_substring
                    (&local_28,(char *)(this + 2),(size_t)(pcVar9 + -2));
          if ((local_28.len != 0) && (local_28.str != (char *)0x0)) {
            *puVar7 = 0;
            sVar6 = 0;
            uVar8 = 0;
            do {
              bVar11 = local_28.len == sVar6;
              if (bVar11) {
                return bVar11;
              }
              cVar1 = local_28.str[sVar6];
              uVar8 = uVar8 * 2;
              *puVar7 = uVar8;
              if (cVar1 != '0') {
                if (cVar1 != '1') {
                  return bVar11;
                }
                uVar8 = uVar8 | 1;
                *puVar7 = uVar8;
              }
              sVar6 = sVar6 + 1;
            } while( true );
          }
          if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
            pcVar2 = (code *)swi(3);
            uVar4 = (*pcVar2)();
            return (bool)uVar4;
          }
          handle_error(0x20a4ad,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x2cce,"!s.empty()");
        }
      }
      else if (bVar3 == 0x4f) {
        if (pcVar9 != (char *)0x2) {
          basic_substring<const_char>::basic_substring
                    (&local_28,(char *)(this + 2),(size_t)(pcVar9 + -2));
          if ((local_28.len != 0) && (local_28.str != (char *)0x0)) {
            *puVar7 = 0;
            sVar6 = 0;
            uVar8 = 0;
            while( true ) {
              bVar11 = local_28.len == sVar6;
              if (bVar11) {
                return bVar11;
              }
              if ((local_28.str[sVar6] & 0xf8U) != 0x30) break;
              uVar8 = ((ulong)(byte)local_28.str[sVar6] + uVar8 * 8) - 0x30;
              *puVar7 = uVar8;
              sVar6 = sVar6 + 1;
            }
            return bVar11;
          }
          if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
            pcVar2 = (code *)swi(3);
            uVar4 = (*pcVar2)();
            return (bool)uVar4;
          }
          handle_error(0x20a4ad,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x2ceb,"!s.empty()");
        }
      }
      else {
        if (bVar3 != 0x58) {
          *puVar7 = 0;
          pcVar5 = (char *)0x0;
          uVar8 = 0;
          while( true ) {
            bVar11 = pcVar9 == pcVar5;
            if (bVar11) {
              return bVar11;
            }
            if (9 < (byte)((char)this[(long)pcVar5] - 0x30U)) break;
            uVar8 = ((ulong)(byte)this[(long)pcVar5] + uVar8 * 10) - 0x30;
            *puVar7 = uVar8;
            pcVar5 = pcVar5 + 1;
          }
          return bVar11;
        }
        if (pcVar9 != (char *)0x2) {
          basic_substring<const_char>::basic_substring
                    (&local_28,(char *)(this + 2),(size_t)(pcVar9 + -2));
          if ((local_28.len != 0) && (local_28.str != (char *)0x0)) {
            *puVar7 = 0;
            sVar6 = 0;
            uVar8 = 0;
            while( true ) {
              bVar11 = local_28.len == sVar6;
              if (bVar11) {
                return bVar11;
              }
              bVar3 = local_28.str[sVar6];
              lVar10 = -0x30;
              if (((9 < (byte)(bVar3 - 0x30)) && (lVar10 = -0x57, 5 < (byte)(bVar3 + 0x9f))) &&
                 (lVar10 = -0x37, 5 < (byte)(bVar3 + 0xbf))) break;
              uVar8 = uVar8 * 0x10 + lVar10 + (ulong)bVar3;
              *puVar7 = uVar8;
              sVar6 = sVar6 + 1;
            }
            return bVar11;
          }
          if ((((byte)s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
            pcVar2 = (code *)swi(3);
            uVar4 = (*pcVar2)();
            return (bool)uVar4;
          }
          handle_error(0x20a4ad,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x2cac,"!s.empty()");
        }
      }
    }
    else if (*this != (c4)0x2d) {
      *puVar7 = 0;
      pcVar5 = (char *)0x0;
      uVar8 = 0;
      while( true ) {
        bVar11 = pcVar9 == pcVar5;
        if (bVar11) {
          return bVar11;
        }
        if (9 < (byte)((char)this[(long)pcVar5] - 0x30U)) break;
        uVar8 = ((ulong)(byte)this[(long)pcVar5] + uVar8 * 10) - 0x30;
        *puVar7 = uVar8;
        pcVar5 = pcVar5 + 1;
      }
      return bVar11;
    }
  }
  return false;
}

Assistant:

bool atou(csubstr str, T * C4_RESTRICT v) noexcept
{
    C4_STATIC_ASSERT(std::is_integral<T>::value);

    if(C4_UNLIKELY(str.len == 0 || str.front() == '-'))
        return false;

    bool parsed_ok = true;
    if(str.str[0] != '0')
    {
        parsed_ok = read_dec(str, v);
    }
    else
    {
        if(str.len > 1)
        {
            const char pfx = str.str[1];
            if(pfx == 'x' || pfx == 'X')
                parsed_ok = str.len > 2 && read_hex(str.sub(2), v);
            else if(pfx == 'b' || pfx == 'B')
                parsed_ok = str.len > 2 && read_bin(str.sub(2), v);
            else if(pfx == 'o' || pfx == 'O')
                parsed_ok = str.len > 2 && read_oct(str.sub(2), v);
            else
                parsed_ok = read_dec(str, v);
        }
        else
        {
            *v = 0; // we know the first character is 0
        }
    }
    return parsed_ok;
}